

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestPackage.cpp
# Opt level: O3

IterateResult __thiscall vkt::TestCaseExecutor::iterate(TestCaseExecutor *this,TestCase *param_1)

{
  TestStatus result;
  qpTestResult local_38 [2];
  long *local_30;
  long local_20 [2];
  
  (*this->m_instance->_vptr_TestInstance[2])(local_38);
  if (local_38[0] != QP_TEST_RESULT_LAST) {
    tcu::TestContext::setTestResult((this->m_context).m_testCtx,local_38[0],(char *)local_30);
  }
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return (uint)(local_38[0] == QP_TEST_RESULT_LAST);
}

Assistant:

tcu::TestNode::IterateResult TestCaseExecutor::iterate (tcu::TestCase*)
{
	DE_ASSERT(m_instance);

	const tcu::TestStatus	result	= m_instance->iterate();

	if (result.isComplete())
	{
		// Vulkan tests shouldn't set result directly
		DE_ASSERT(m_context.getTestContext().getTestResult() == QP_TEST_RESULT_LAST);
		m_context.getTestContext().setTestResult(result.getCode(), result.getDescription().c_str());
		return tcu::TestNode::STOP;
	}
	else
		return tcu::TestNode::CONTINUE;
}